

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O1

string * __thiscall
Progress::formatTime_abi_cxx11_(string *__return_storage_ptr__,Progress *this,time_t t)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  char *__format;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  char buffer [128];
  char local_98 [136];
  
  auVar1 = SEXT816(t % 0x15180) * SEXT816(0x48d159e26af37c05);
  uVar4 = (ulong)(uint)((int)(auVar1._8_8_ >> 10) - (auVar1._12_4_ >> 0x1f));
  auVar1 = SEXT816(t % 0xe10) * ZEXT816(0x8888888888888889);
  uVar7 = (int)(auVar1._8_8_ >> 5) - (auVar1._12_4_ >> 0x1f);
  uVar6 = (ulong)(uint)((int)t + ((int)(SUB168(SEXT816(t) * ZEXT816(0x8888888888888889),8) >> 5) -
                                 (SUB164(SEXT816(t) * ZEXT816(0x8888888888888889),0xc) >> 0x1f)) *
                                 -0x3c);
  if ((int)(t / 0x15180) == 0) {
    if (t % 0x15180 + 0xe0fU < 0x1c1f) {
      snprintf(local_98,0x80,"%02d:%02d",(ulong)uVar7,uVar6);
      goto LAB_001051ee;
    }
    __format = "%d:%02d:%02d";
    uVar5 = (ulong)uVar7;
    uVar3 = uVar4;
  }
  else {
    __format = "%dd %d:%02d:%02d";
    uVar6 = (ulong)uVar7;
    uVar3 = t / 0x15180;
    uVar5 = uVar4;
  }
  snprintf(local_98,0x80,__format,uVar3,uVar5,uVar6);
LAB_001051ee:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(local_98);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_98,local_98 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Progress::formatTime (time_t t)
{
  char buffer [128];

  int days    =  t          / 86400;
  int hours   = (t % 86400) / 3600;
  int minutes = (t %  3600) / 60;
  int seconds =  t % 60;

  if (days)
    snprintf (buffer, 128, "%dd %d:%02d:%02d", days, hours, minutes, seconds);
  else if (hours)
    snprintf (buffer, 128,     "%d:%02d:%02d",       hours, minutes, seconds);
  else
    snprintf (buffer, 128,        "%02d:%02d",              minutes, seconds);

  return std::string (buffer);
}